

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
DecodeBase64(optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *__return_storage_ptr__,string_view str)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  size_t bits;
  ulong uVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  value_type_conflict local_39;
  long local_38;
  
  pbVar5 = (byte *)str._M_str;
  sVar3 = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])str & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
    if (sVar3 == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = sVar3 - (pbVar5[sVar3 - 1] == 0x3d);
      lVar6 = lVar6 - (ulong)(pbVar5[lVar6 + -1] == 0x3d);
    }
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
               (ulong)(lVar6 * 3) >> 2);
    pbVar7 = pbVar5 + lVar6;
    uVar4 = 0;
    uVar2 = 0;
    for (; pbVar5 != pbVar7; pbVar5 = pbVar5 + 1) {
      if ((long)DecodeBase64::decode64_table[*pbVar5] < 0) goto LAB_00622e1d;
      uVar2 = (ulong)(((uint)uVar2 & 0x7f) << 6) | (long)DecodeBase64::decode64_table[*pbVar5];
      uVar4 = uVar4 + 6;
      while (7 < uVar4) {
        uVar4 = uVar4 - 8;
        local_39 = (value_type_conflict)(uVar2 >> ((byte)uVar4 & 0x3f));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,&local_39);
      }
    }
    if ((uVar4 < 6) && ((uVar2 << (8U - (char)uVar4 & 0x3f) & 0xfe) == 0)) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl = local_58._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8) =
           local_58._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10) =
           local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = true;
    }
    else {
LAB_00622e1d:
      bVar1 = false;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_engaged = bVar1;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_engaged = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::vector<unsigned char>> DecodeBase64(std::string_view str)
{
    static const int8_t decode64_table[256]{
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, 62, -1, -1, -1, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60, 61, -1, -1,
        -1, -1, -1, -1, -1,  0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1, -1, -1, 26, 27, 28,
        29, 30, 31, 32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42, 43, 44, 45, 46, 47, 48,
        49, 50, 51, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1
    };

    if (str.size() % 4 != 0) return {};
    /* One or two = characters at the end are permitted. */
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);

    std::vector<unsigned char> ret;
    ret.reserve((str.size() * 3) / 4);
    bool valid = ConvertBits<6, 8, false>(
        [&](unsigned char c) { ret.push_back(c); },
        str.begin(), str.end(),
        [](char c) { return decode64_table[uint8_t(c)]; }
    );
    if (!valid) return {};

    return ret;
}